

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O3

void __thiscall
wasm::MultiMemoryLowering::Replacer::visitMemoryGrow(Replacer *this,MemoryGrow *curr)

{
  pointer pNVar1;
  char *pcVar2;
  uintptr_t uVar3;
  mapped_type *pmVar4;
  Expression *expression;
  MixedArena *this_00;
  initializer_list<wasm::Expression_*> __l;
  Expression *local_60;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_58;
  undefined8 local_40;
  allocator_type local_31;
  
  pmVar4 = std::__detail::
           _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&this->parent->memoryIdxMap,&curr->memory);
  pNVar1 = (this->parent->memoryGrowNames).
           super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_40 = pNVar1[*pmVar4].super_IString.str._M_len;
  pcVar2 = pNVar1[*pmVar4].super_IString.str._M_str;
  local_60 = curr->delta;
  __l._M_len = 1;
  __l._M_array = &local_60;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_58,__l,&local_31);
  uVar3 = (curr->super_SpecificExpression<(wasm::Expression::Id)21>).super_Expression.type.id;
  this_00 = &((this->builder).wasm)->allocator;
  expression = (Expression *)MixedArena::allocSpace(this_00,0x48,8);
  expression->_id = CallId;
  *(undefined8 *)(expression + 1) = 0;
  expression[1].type.id = 0;
  *(undefined8 *)(expression + 2) = 0;
  expression[2].type.id = (uintptr_t)this_00;
  *(undefined1 *)&expression[4]._id = InvalidId;
  (expression->type).id = uVar3;
  *(undefined8 *)(expression + 3) = local_40;
  expression[3].type.id = (uintptr_t)pcVar2;
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)(expression + 1),
             &local_58);
  *(undefined1 *)&expression[4]._id = InvalidId;
  Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
  ::replaceCurrent(&(this->
                    super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
                    ).
                    super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                    .
                    super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                   ,expression);
  if (local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void visitMemoryGrow(MemoryGrow* curr) {
      auto idx = parent.memoryIdxMap.at(curr->memory);
      Name funcName = parent.memoryGrowNames[idx];
      replaceCurrent(builder.makeCall(funcName, {curr->delta}, curr->type));
    }